

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-eintr-handling.c
# Opt level: O3

int run_test_eintr_handling(void)

{
  int iVar1;
  char *loop;
  uv_loop_t *loop_00;
  int *piVar2;
  uv_thread_t thread;
  thread_ctx ctx;
  uv_signal_t signal;
  undefined1 local_d0 [48];
  
  iov = uv_buf_init(buf,0x20);
  loop = (char *)uv_default_loop();
  ::loop = (uv_loop_t *)loop;
  iVar1 = uv_signal_init((uv_loop_t *)loop,(uv_signal_t *)&stack0xffffffffffffff60);
  if (iVar1 == 0) {
    loop = &stack0xffffffffffffff60;
    iVar1 = uv_signal_start((uv_signal_t *)loop,sig_func,10);
    if (iVar1 != 0) goto LAB_0014b9ed;
    piVar2 = pipe_fds;
    iVar1 = pipe(pipe_fds);
    loop = (char *)piVar2;
    if (iVar1 != 0) goto LAB_0014b9f2;
    loop = local_d0;
    iVar1 = uv_thread_create((uv_thread_t *)loop,thread_main,local_d0 + 8);
    if (iVar1 != 0) goto LAB_0014b9f7;
    loop = (char *)::loop;
    iVar1 = uv_fs_read(::loop,&read_req,pipe_fds[0],&iov,1,-1,(uv_fs_cb)0x0);
    if (iVar1 != 0xd) goto LAB_0014b9fc;
    loop = buf;
    iVar1 = strcmp(buf,test_buf);
    if (iVar1 != 0) goto LAB_0014ba01;
    loop = (char *)::loop;
    iVar1 = uv_run(::loop,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_0014ba06;
    loop = (char *)(ulong)(uint)pipe_fds[0];
    iVar1 = close(pipe_fds[0]);
    if (iVar1 != 0) goto LAB_0014ba0b;
    loop = (char *)(ulong)(uint)pipe_fds[1];
    iVar1 = close(pipe_fds[1]);
    if (iVar1 == 0) {
      uv_close((uv_handle_t *)&stack0xffffffffffffff60,(uv_close_cb)0x0);
      loop_00 = uv_default_loop();
      uv_walk(loop_00,close_walk_cb,(void *)0x0);
      uv_run(loop_00,UV_RUN_DEFAULT);
      loop = (char *)uv_default_loop();
      iVar1 = uv_loop_close((uv_loop_t *)loop);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0014ba15;
    }
  }
  else {
    run_test_eintr_handling_cold_1();
LAB_0014b9ed:
    run_test_eintr_handling_cold_2();
LAB_0014b9f2:
    run_test_eintr_handling_cold_3();
LAB_0014b9f7:
    run_test_eintr_handling_cold_4();
LAB_0014b9fc:
    run_test_eintr_handling_cold_5();
LAB_0014ba01:
    run_test_eintr_handling_cold_6();
LAB_0014ba06:
    run_test_eintr_handling_cold_7();
LAB_0014ba0b:
    run_test_eintr_handling_cold_8();
  }
  run_test_eintr_handling_cold_9();
LAB_0014ba15:
  run_test_eintr_handling_cold_10();
  if (((ulong)((uv_loop_t *)loop)->watcher_queue[0] & 3) == 0) {
    uv__signal_stop((uv_signal_t *)loop);
    return 0;
  }
  __assert_fail("!uv__is_closing(handle)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/signal.c"
                ,0x214,"int uv_signal_stop(uv_signal_t *)");
}

Assistant:

TEST_IMPL(eintr_handling) {
  struct thread_ctx ctx;
  uv_thread_t thread;
  uv_signal_t signal;
  int nread;

  iov = uv_buf_init(buf, sizeof(buf));
  loop = uv_default_loop();

  ASSERT(0 == uv_signal_init(loop, &signal));
  ASSERT(0 == uv_signal_start(&signal, sig_func, SIGUSR1));

  ASSERT(0 == pipe(pipe_fds));
  ASSERT(0 == uv_thread_create(&thread, thread_main, &ctx));

  nread = uv_fs_read(loop, &read_req, pipe_fds[0], &iov, 1, -1, NULL);

  ASSERT(nread == sizeof(test_buf));
  ASSERT(0 == strcmp(buf, test_buf));

  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));

  ASSERT(0 == close(pipe_fds[0]));
  ASSERT(0 == close(pipe_fds[1]));
  uv_close((uv_handle_t*) &signal, NULL);

  MAKE_VALGRIND_HAPPY();
  return 0;
}